

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_json.c
# Opt level: O1

char * parse_value(cJSON *item,char *value)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  byte *pbVar6;
  int iVar7;
  byte bVar8;
  byte *pbVar9;
  double dVar10;
  double dVar11;
  
  pcVar4 = ep;
  if (value == (char *)0x0) {
LAB_0017de49:
    ep = pcVar4;
    pcVar4 = (char *)0x0;
  }
  else {
    iVar3 = strncmp(value,"null",4);
    if (iVar3 == 0) {
      item->type = 2;
    }
    else {
      iVar3 = strncmp(value,"false",5);
      if (iVar3 == 0) {
        item->type = 0;
        return value + 5;
      }
      iVar3 = strncmp(value,"true",4);
      if (iVar3 != 0) {
        cVar2 = *value;
        if (cVar2 == '-') {
LAB_0017dc9d:
          uVar5 = (ulong)(cVar2 == '-');
          pbVar9 = (byte *)(value + (value[uVar5] == '0') + uVar5);
          dVar10 = 0.0;
          if ((byte)(value[(value[uVar5] == '0') + uVar5] - 0x31U) < 9) {
            dVar11 = 0.0;
            pbVar6 = pbVar9;
            do {
              pbVar9 = pbVar6 + 1;
              dVar11 = dVar11 * 10.0 + (double)((char)*pbVar6 + -0x30);
              pbVar1 = pbVar6 + 1;
              pbVar6 = pbVar9;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
          else {
            dVar11 = 0.0;
          }
          if ((*pbVar9 == 0x2e) && ((byte)(pbVar9[1] - 0x30) < 10)) {
            dVar10 = 0.0;
            pbVar6 = pbVar9 + 1;
            do {
              pbVar9 = pbVar6 + 1;
              dVar11 = dVar11 * 10.0 + (double)((char)*pbVar6 + -0x30);
              dVar10 = dVar10 + -1.0;
              pbVar1 = pbVar6 + 1;
              pbVar6 = pbVar9;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
          iVar3 = 0;
          if ((*pbVar9 | 0x20) == 0x65) {
            if (pbVar9[1] == 0x2d) {
              pbVar9 = pbVar9 + 2;
              iVar7 = -1;
            }
            else {
              iVar7 = 1;
              if (pbVar9[1] == 0x2b) {
                pbVar9 = pbVar9 + 2;
              }
              else {
                pbVar9 = pbVar9 + 1;
              }
            }
            bVar8 = *pbVar9;
            iVar3 = 0;
            if ((byte)(bVar8 - 0x30) < 10) {
              iVar3 = 0;
              do {
                iVar3 = (uint)(byte)(bVar8 - 0x30) + iVar3 * 10;
                bVar8 = pbVar9[1];
                pbVar9 = pbVar9 + 1;
              } while ((byte)(bVar8 - 0x30) < 10);
            }
          }
          else {
            iVar7 = 1;
          }
          if (cVar2 == '-') {
            dVar11 = -dVar11;
          }
          dVar10 = pow(10.0,dVar10 + (double)(iVar7 * iVar3));
          item->valuedouble = dVar10 * dVar11;
          item->valueint = (int)(dVar10 * dVar11);
          item->type = 3;
          return (char *)pbVar9;
        }
        if (cVar2 == '\"') {
          pcVar4 = parse_string(item,value);
          return pcVar4;
        }
        if ((byte)(cVar2 - 0x30U) < 10) goto LAB_0017dc9d;
        if (cVar2 == '{') {
          pcVar4 = parse_object(item,value);
          return pcVar4;
        }
        pcVar4 = value;
        if (cVar2 == '[') {
          pcVar4 = parse_array(item,value);
          return pcVar4;
        }
        goto LAB_0017de49;
      }
      item->type = 1;
      item->valueint = 1;
    }
    pcVar4 = value + 4;
  }
  return pcVar4;
}

Assistant:

static const char *parse_value(cJSON *item,const char *value)
{
	if (!value)						return 0;	/* Fail on null. */
	if (!strncmp(value,"null",4))	{ item->type=cJSON_NULL;  return value+4; }
	if (!strncmp(value,"false",5))	{ item->type=cJSON_False; return value+5; }
	if (!strncmp(value,"true",4))	{ item->type=cJSON_True; item->valueint=1;	return value+4; }
	if (*value=='\"')				{ return parse_string(item,value); }
	if (*value=='-' || (*value>='0' && *value<='9'))	{ return parse_number(item,value); }
	if (*value=='[')				{ return parse_array(item,value); }
	if (*value=='{')				{ return parse_object(item,value); }

	ep=value;return 0;	/* failure. */
}